

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O0

void ecx_dcsync01(ecx_contextt *context,uint16 slave,boolean act,uint32 CyclTime0,uint32 CyclTime1,
                 uint32 CyclShift)

{
  int iVar1;
  uint32 local_3c;
  long lStack_38;
  int32 tc;
  int64 t1;
  int64 t;
  uint32 uStack_20;
  uint16 slaveh;
  uint16 wc;
  uint8 RA;
  uint8 h;
  uint32 CyclShift_local;
  uint32 CyclTime1_local;
  uint32 CyclTime0_local;
  boolean act_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  t._2_2_ = context->slavelist[slave].configadr;
  t._6_1_ = 0;
  uStack_20 = CyclShift;
  _wc = CyclTime1;
  CyclShift_local = CyclTime0;
  CyclTime1_local._1_1_ = act;
  CyclTime1_local._2_2_ = slave;
  _CyclTime0_local = context;
  iVar1 = ecx_FPWR(context->port,t._2_2_,0x981,1,(void *)((long)&t + 6),2000);
  t._4_2_ = (undefined2)iVar1;
  if (CyclTime1_local._1_1_ != '\0') {
    t._6_1_ = 7;
  }
  t._7_1_ = 0;
  iVar1 = ecx_FPWR(_CyclTime0_local->port,t._2_2_,0x980,1,(void *)((long)&t + 7),2000);
  t._4_2_ = (undefined2)iVar1;
  iVar1 = ecx_FPRD(_CyclTime0_local->port,t._2_2_,0x910,8,&stack0xffffffffffffffc8,2000);
  t._4_2_ = (undefined2)iVar1;
  if (CyclShift_local == 0) {
    t1 = lStack_38 + 100000000 + (ulong)uStack_20;
  }
  else {
    t1 = ((lStack_38 + 100000000) / (long)(ulong)CyclShift_local) * (ulong)CyclShift_local +
         (ulong)CyclShift_local + (ulong)uStack_20;
  }
  iVar1 = ecx_FPWR(_CyclTime0_local->port,t._2_2_,0x990,8,&t1,2000);
  t._4_2_ = (undefined2)iVar1;
  local_3c = CyclShift_local;
  iVar1 = ecx_FPWR(_CyclTime0_local->port,t._2_2_,0x9a0,4,&local_3c,2000);
  t._4_2_ = (undefined2)iVar1;
  local_3c = _wc;
  iVar1 = ecx_FPWR(_CyclTime0_local->port,t._2_2_,0x9a4,4,&local_3c,2000);
  t._4_2_ = (undefined2)iVar1;
  ecx_FPWR(_CyclTime0_local->port,t._2_2_,0x981,1,(void *)((long)&t + 6),2000);
  return;
}

Assistant:

void ecx_dcsync01(ecx_contextt *context, uint16 slave, boolean act, uint32 CyclTime0, uint32 CyclTime1, uint32 CyclShift)
{
   uint8 h, RA;
   uint16 wc, slaveh;
   int64 t, t1;
   int32 tc;

   slaveh = context->slavelist[slave].configadr;
   RA = 0;

   /* stop cyclic operation, ready for next trigger */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); 
   if (act)
   {
      RA = 1 + 2 + 4;    /* act cyclic operation and sync0 + sync1 */
   }
   h = 0;
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCUC, sizeof(h), &h, EC_TIMEOUTRET); /* write access to ethercat */
   wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSYSTIME, sizeof(t1), &t1, EC_TIMEOUTRET); /* read local time of slave */
   t1 = etohll(t1);

   /* Calculate first trigger time, always a whole multiple of CyclTime rounded up
   plus the shifttime (can be negative)
   This insures best sychronisation between slaves, slaves with the same CyclTime
   will sync at the same moment (you can use CyclShift to shift the sync) */
   if (CyclTime0 > 0)
   {
      t = ((t1 + SyncDelay) / CyclTime0) * CyclTime0 + CyclTime0 + CyclShift;
   }
   else
   {
      t = t1 + SyncDelay + CyclShift;
      /* first trigger at T1 + CyclTime + SyncDelay + CyclShift in ns */
   }
   t = htoell(t);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSTART0, sizeof(t), &t, EC_TIMEOUTRET); /* SYNC0 start time */
   tc = htoel(CyclTime0);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCYCLE0, sizeof(tc), &tc, EC_TIMEOUTRET); /* SYNC0 cycle time */
   tc = htoel(CyclTime1);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCYCLE1, sizeof(tc), &tc, EC_TIMEOUTRET); /* SYNC1 cycle time */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); /* activate cyclic operation */
}